

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O0

MatchFunction * __thiscall
duckdb::RowMatcher::GetMatchFunction<true,long>(RowMatcher *this,ExpressionType predicate)

{
  undefined8 uVar1;
  undefined1 in_DL;
  MatchFunction *in_RDI;
  MatchFunction *result;
  ExpressionType value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  InternalException *in_stack_ffffffffffffffd0;
  
  MatchFunction::MatchFunction((MatchFunction *)0x16039aa);
  switch(in_DL) {
  case 0x19:
    in_RDI->function = TemplatedMatch<true,long,duckdb::Equals>;
    break;
  case 0x1a:
    in_RDI->function = TemplatedMatch<true,long,duckdb::NotEquals>;
    break;
  case 0x1b:
    in_RDI->function = TemplatedMatch<true,long,duckdb::LessThan>;
    break;
  case 0x1c:
    in_RDI->function = TemplatedMatch<true,long,duckdb::GreaterThan>;
    break;
  case 0x1d:
    in_RDI->function = TemplatedMatch<true,long,duckdb::LessThanEquals>;
    break;
  case 0x1e:
    in_RDI->function = TemplatedMatch<true,long,duckdb::GreaterThanEquals>;
    break;
  default:
    value = 1;
    uVar1 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc8,
               "Unsupported ExpressionType for RowMatcher::GetMatchFunction: %s",
               (allocator *)&stack0xffffffffffffffc7);
    EnumUtil::ToString<duckdb::ExpressionType>(value);
    InternalException::InternalException<std::__cxx11::string>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    __cxa_throw(uVar1,&InternalException::typeinfo,InternalException::~InternalException);
  case 0x25:
    in_RDI->function = TemplatedMatch<true,long,duckdb::DistinctFrom>;
    break;
  case 0x28:
    in_RDI->function = TemplatedMatch<true,long,duckdb::NotDistinctFrom>;
  }
  return in_RDI;
}

Assistant:

MatchFunction RowMatcher::GetMatchFunction(const ExpressionType predicate) {
	MatchFunction result;
	switch (predicate) {
	case ExpressionType::COMPARE_EQUAL:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, Equals>;
		break;
	case ExpressionType::COMPARE_NOTEQUAL:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, NotEquals>;
		break;
	case ExpressionType::COMPARE_DISTINCT_FROM:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, DistinctFrom>;
		break;
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, NotDistinctFrom>;
		break;
	case ExpressionType::COMPARE_GREATERTHAN:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, GreaterThan>;
		break;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, GreaterThanEquals>;
		break;
	case ExpressionType::COMPARE_LESSTHAN:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, LessThan>;
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		result.function = TemplatedMatch<NO_MATCH_SEL, T, LessThanEquals>;
		break;
	default:
		throw InternalException("Unsupported ExpressionType for RowMatcher::GetMatchFunction: %s",
		                        EnumUtil::ToString(predicate));
	}
	return result;
}